

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

bool SparseKeyTest<32,Blob<128>>
               (hashfunc<Blob<128>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  int iVar3;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  Blob<128> h;
  Blob<32> local_6c;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> local_68;
  value_type local_48;
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x20,pcVar2,(ulong)(uint)setbits);
  local_68.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6c.bytes[0] = '\0';
  local_6c.bytes[1] = '\0';
  local_6c.bytes[2] = '\0';
  local_6c.bytes[3] = '\0';
  local_68.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (iVar3 != 0) {
    local_48.bytes[0] = '\0';
    local_48.bytes[1] = '\0';
    local_48.bytes[2] = '\0';
    local_48.bytes[3] = '\0';
    local_48.bytes[4] = '\0';
    local_48.bytes[5] = '\0';
    local_48.bytes[6] = '\0';
    local_48.bytes[7] = '\0';
    local_48.bytes[8] = '\0';
    local_48.bytes[9] = '\0';
    local_48.bytes[10] = '\0';
    local_48.bytes[0xb] = '\0';
    local_48.bytes[0xc] = '\0';
    local_48.bytes[0xd] = '\0';
    local_48.bytes[0xe] = '\0';
    local_48.bytes[0xf] = '\0';
    (*hash.m_hash)(&local_6c,4,0,&local_48);
    std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back(&local_68,&local_48);
  }
  SparseKeygenRecurse<Blob<32>,Blob<128>>(hash.m_hash,0,setbits,inclusive,&local_6c,&local_68);
  printf("%d keys\n",
         (ulong)((long)local_68.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)local_68.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 4);
  bVar1 = TestHashList<Blob<128>>(&local_68,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  if (local_68.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}